

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * __thiscall re2c::Scanner::ichr(Scanner *this,uint32_t c)

{
  bool bVar1;
  uint32_t uVar2;
  RegExp *e1;
  RegExp *e2;
  RegExp *u;
  RegExp *l;
  uint32_t c_local;
  Scanner *this_local;
  
  bVar1 = is_alpha(c);
  if (bVar1) {
    uVar2 = to_lower_unsafe(c);
    e1 = schr(this,uVar2);
    uVar2 = to_upper_unsafe(c);
    e2 = schr(this,uVar2);
    this_local = (Scanner *)mkAlt(e1,e2);
  }
  else {
    this_local = (Scanner *)schr(this,c);
  }
  return (RegExp *)this_local;
}

Assistant:

RegExp *Scanner::ichr(uint32_t c) const
{
	if (is_alpha(c)) {
		RegExp *l = schr(to_lower_unsafe(c));
		RegExp *u = schr(to_upper_unsafe(c));
		return mkAlt(l, u);
	} else {
		return schr(c);
	}
}